

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

bool __thiscall FxBinary::ResolveLR(FxBinary *this,FCompileContext *ctx,bool castnumeric)

{
  FxExpression *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  FxExpression *pFVar4;
  PFloat **ppPVar5;
  PType *pPVar6;
  undefined7 in_register_00000011;
  undefined4 extraout_var_00;
  
  pFVar1 = this->left;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar3 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx,CONCAT71(in_register_00000011,castnumeric));
    this->left = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  pFVar1 = this->right;
  if (pFVar1 == (FxExpression *)0x0) {
LAB_005d1a25:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return false;
  }
  iVar3 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
  pFVar4 = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
  this->right = pFVar4;
  pFVar1 = this->left;
  if ((pFVar1 == (FxExpression *)0x0) || (pFVar4 == (FxExpression *)0x0)) goto LAB_005d1a25;
  pPVar6 = pFVar1->ValueType;
  if ((pPVar6 == (PType *)TypeBool) && (pFVar4->ValueType == pPVar6)) {
    (this->super_FxExpression).ValueType = (PType *)TypeBool;
    pPVar6 = pFVar1->ValueType;
  }
  iVar3 = (**(code **)(*(long *)&pPVar6->super_DObject + 0x90))();
  if ((iVar3 == 0) &&
     (iVar3 = (*(this->right->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar3 == 0)) {
    ppPVar5 = (PFloat **)&TypeSInt32;
  }
  else {
    bVar2 = FxExpression::IsNumeric(this->left);
    if ((bVar2) && (bVar2 = FxExpression::IsNumeric(this->right), bVar2)) {
      ppPVar5 = &TypeFloat64;
    }
    else {
      iVar3 = (*(this->left->ValueType->super_DObject)._vptr_DObject[0x12])();
      if ((iVar3 == 3) && (pPVar6 = this->left->ValueType, pPVar6 == this->right->ValueType))
      goto LAB_005d1a6d;
      ppPVar5 = (PFloat **)&TypeVoid;
    }
  }
  pPVar6 = (PType *)*ppPVar5;
LAB_005d1a6d:
  (this->super_FxExpression).ValueType = pPVar6;
  return true;
}

Assistant:

bool FxBinary::ResolveLR(FCompileContext& ctx, bool castnumeric)
{
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return false;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	if (left->ValueType->GetRegType() == REGT_INT && right->ValueType->GetRegType() == REGT_INT)
	{
		ValueType = TypeSInt32;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		ValueType = TypeFloat64;
	}
	else if (left->ValueType->GetRegType() == REGT_POINTER && left->ValueType == right->ValueType)
	{
		ValueType = left->ValueType;
	}
	else
	{
		ValueType = TypeVoid;
	}

	if (castnumeric)
	{
		// later!
	}
	return true;
}